

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

uint64_t __thiscall slang::ConstantValue::getBitstreamWidth(ConstantValue *this)

{
  __index_type _Var1;
  pointer pCVar2;
  SVQueue *pSVar3;
  _Elt_pointer pCVar4;
  variant_alternative_t<9UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar7;
  _Base_ptr p_Var8;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar10;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  _Map_pointer ppCVar14;
  _Elt_pointer pCVar15;
  ConstantValue *cv;
  pointer this_00;
  _Elt_pointer this_01;
  _Rb_tree_header *p_Var16;
  
  while (_Var1 = *(__index_type *)
                  ((long)&(((SVUnion *)this)->value).value.
                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  + 0x20), _Var1 == '\t') {
    pvVar5 = std::
             get<9ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&this->value);
    this = &pvVar5->ptr->value;
  }
  switch(_Var1) {
  case '\x01':
    pvVar6 = std::
             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&this->value);
    return (ulong)(pvVar6->super_SVIntStorage).bitWidth;
  case '\x05':
    pvVar10 = std::
              get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&this->value);
    this_00 = (pvVar10->
              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (pvVar10->
             super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pCVar2) {
      uVar13 = 0;
      do {
        uVar12 = getBitstreamWidth(this_00);
        uVar13 = uVar13 + uVar12;
        this_00 = this_00 + 1;
      } while (this_00 != pCVar2);
      return uVar13;
    }
    break;
  case '\x06':
    pvVar9 = std::
             get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&this->value);
    return pvVar9->_M_string_length << 3;
  case '\a':
    pvVar7 = std::
             get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&this->value);
    p_Var8 = (pvVar7->ptr->
             super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(pvVar7->ptr->
               super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               )._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var16) {
      uVar13 = 0;
      do {
        uVar12 = getBitstreamWidth((ConstantValue *)&p_Var8[2]._M_parent);
        uVar13 = uVar13 + uVar12;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var16);
      return uVar13;
    }
    break;
  case '\b':
    pvVar11 = std::
              get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&this->value);
    pSVar3 = pvVar11->ptr;
    this_01 = (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    pCVar4 = (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (this_01 != pCVar4) {
      pCVar15 = (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      ppCVar14 = (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      uVar13 = 0;
      do {
        uVar12 = getBitstreamWidth(this_01);
        this_01 = this_01 + 1;
        if (this_01 == pCVar15) {
          this_01 = ppCVar14[1];
          ppCVar14 = ppCVar14 + 1;
          pCVar15 = this_01 + 0xc;
        }
        uVar13 = uVar13 + uVar12;
      } while (this_01 != pCVar4);
      return uVar13;
    }
  }
  return 0;
}

Assistant:

uint64_t ConstantValue::getBitstreamWidth() const {
    // Note that we don't have to worry about overflow in this
    // method because we have an artificial limit on how
    // large constant values are allowed to be.
    // TODO: actually implement the mentioned limit
    if (isInteger())
        return integer().getBitWidth();

    if (isString())
        return str().length() * CHAR_BIT;

    uint64_t width = 0;
    if (isUnpacked()) {
        for (const auto& cv : elements())
            width += cv.getBitstreamWidth();
    }
    else if (isMap()) {
        for (const auto& kv : *map())
            width += kv.second.getBitstreamWidth();
    }
    else if (isQueue()) {
        for (const auto& cv : *queue())
            width += cv.getBitstreamWidth();
    }
    else if (isUnion()) {
        width = unionVal()->value.getBitstreamWidth();
    }

    return width;
}